

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

bool __thiscall
xscript::parser::ast::parse_variable_initializer
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  bool bVar1;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  allocator<char> local_19;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,VARIABLE_INITIALIZER);
  if ((this->cur_token).type == TK_ASSIGN) {
    next(this);
    bVar1 = parse_expression(this,parent_00);
    return bVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",&local_19)
  ;
  local_50._M_len = 0xc;
  local_50._M_str = "\'=\' expected";
  args._M_len = 1;
  args._M_array = &local_50;
  process_failover(this,&local_40,0x1b6,args,true);
  std::__cxx11::string::~string((string *)&local_40);
  return false;
}

Assistant:

bool ast::parse_variable_initializer(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(VARIABLE_INITIALIZER);

    if (cur_token != tokenizer::TK_ASSIGN) {
        return failover({"'=' expected"});
    }
    next();

    if (!parse_expression(node)) {
        return false;
    }

    return true;
}